

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu.cpp
# Opt level: O0

int __thiscall ncnn::SELU::forward_inplace(SELU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  int i;
  float *ptr;
  int q;
  float alphaxlambda;
  int size;
  int channels;
  int h;
  int w;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  int local_88;
  Mat local_78;
  Mat *local_38;
  int local_30;
  float local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = local_1c * local_20;
  local_2c = *(float *)(in_RDI + 0x80) * *(float *)(in_RDI + 0x84);
  for (local_30 = 0; local_30 < local_24; local_30 = local_30 + 1) {
    this_00 = &local_78;
    Mat::channel(in_stack_ffffffffffffff68,(int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff68 = (Mat *)Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x1c356d);
    local_38 = in_stack_ffffffffffffff68;
    for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
      pfVar1 = (float *)((long)&local_38->data + (long)local_88 * 4);
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        *(float *)((long)&local_38->data + (long)local_88 * 4) =
             *(float *)(in_RDI + 0x84) * *(float *)((long)&local_38->data + (long)local_88 * 4);
      }
      else {
        dVar2 = std::exp((double)(ulong)(uint)*(float *)((long)&local_38->data + (long)local_88 * 4)
                        );
        *(float *)((long)&local_38->data + (long)local_88 * 4) = (SUB84(dVar2,0) - 1.0) * local_2c;
      }
    }
  }
  return 0;
}

Assistant:

int SELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    float alphaxlambda = alpha * lambda;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = (exp(ptr[i]) - 1.f) * alphaxlambda;
            else
                ptr[i] *= lambda;
        }
    }

    return 0;
}